

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O3

NodeAVL * avlFindAndDeleteMin0(NodeAVL *nd,void **ptr)

{
  NodeAVL *pNVar1;
  
  if (nd->left != (NodeAVL *)0x0) {
    pNVar1 = avlFindAndDeleteMin0(nd->left,ptr);
    nd->left = pNVar1;
    pNVar1 = avlBalance(nd);
    return pNVar1;
  }
  *ptr = nd->ptr;
  pNVar1 = nd->right;
  if (pNVar1 != (NodeAVL *)0x0) {
    pNVar1->parent = nd->parent;
  }
  free(nd);
  return pNVar1;
}

Assistant:

NodeAVL* avlFindAndDeleteMin0( NodeAVL *nd, void **ptr ){
    #ifdef DEBUG_AVL
      printf( "avlFindAndDeleteMin0 id=%d\n", nd->id );
    #endif
    if( !nd->left ){
        *ptr = nd->ptr;
        NodeAVL *r = nd->right;
        if (r) r->parent = nd->parent;
        free(nd);
        return r;
    }
    nd->left = avlFindAndDeleteMin0( nd->left, ptr );
    return avlBalance(nd);
}